

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datapiece.cc
# Opt level: O2

StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
google::protobuf::util::converter::DataPiece::ToString_abi_cxx11_
          (StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,DataPiece *this)

{
  char *pcVar1;
  string *this_00;
  StringPiece value_str;
  StringPiece SVar2;
  StringPiece src;
  StringPiece local_78;
  string local_68;
  _Alloc_hider local_48;
  string base64;
  
  if (this->type_ == TYPE_BYTES) {
    local_48._M_p = (pointer)&base64._M_string_length;
    base64._M_dataplus._M_p = (pointer)0x0;
    base64._M_string_length._0_1_ = 0;
    SVar2 = protobuf::internal::StringPiecePod::operator_cast_to_StringPiece(&(this->field_2).str_);
    src.length_ = (stringpiece_ssize_type)&stack0xffffffffffffffb8;
    src.ptr_ = (char *)SVar2.length_;
    Base64Escape((protobuf *)SVar2.ptr_,src,(string *)&stack0xffffffffffffffb8);
    StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    StatusOr(__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffb8);
  }
  else {
    if (this->type_ != TYPE_STRING) {
      StringPiece::StringPiece(&local_78,"Cannot convert to string.");
      SVar2.length_ = local_78.length_;
      SVar2.ptr_ = local_78.ptr_;
      ValueAsStringOrDefault_abi_cxx11_(&local_68,this,SVar2);
      pcVar1 = (char *)StringPiece::CheckedSsizeTFromSizeT(local_68._M_string_length);
      value_str.length_ = local_78.length_;
      value_str.ptr_ = pcVar1;
      anon_unknown_1::InvalidArgument
                ((Status *)&stack0xffffffffffffffb8,(anon_unknown_1 *)local_68._M_dataplus._M_p,
                 value_str);
      StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      StatusOr(__return_storage_ptr__,(Status *)&stack0xffffffffffffffb8);
      std::__cxx11::string::~string((string *)&base64);
      this_00 = &local_68;
      goto LAB_003245ad;
    }
    protobuf::internal::StringPiecePod::ToString_abi_cxx11_
              ((string *)&stack0xffffffffffffffb8,&(this->field_2).str_);
    StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    StatusOr(__return_storage_ptr__,(string *)&stack0xffffffffffffffb8);
  }
  this_00 = (string *)&stack0xffffffffffffffb8;
LAB_003245ad:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

StatusOr<std::string> DataPiece::ToString() const {
  switch (type_) {
    case TYPE_STRING:
      return std::string(str_);
    case TYPE_BYTES: {
      std::string base64;
      Base64Escape(str_, &base64);
      return base64;
    }
    default:
      return InvalidArgument(
          ValueAsStringOrDefault("Cannot convert to string."));
  }
}